

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

void __thiscall higan::HttpResponse::EncodeToBuffer(HttpResponse *this,Buffer *buffer)

{
  Buffer *this_00;
  FileForRead *this_01;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  StatusCode in_EDX;
  _Rb_tree_header *p_Var5;
  char *__end;
  char local_a8 [8];
  char line_buff [64];
  string local_50;
  
  if (buffer != (Buffer *)0x0) {
    StatusCodeToString_abi_cxx11_(&local_50,(HttpResponse *)(ulong)this->status_code_,in_EDX);
    iVar1 = snprintf(local_a8,0x40,"HTTP/1.1 %s\r\n",local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Buffer::Append(buffer,local_a8,(long)iVar1);
    if (this->close_connection_ == true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Connection: close\r\n","");
      Buffer::Append(buffer,&local_50);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Connection: Keep-Alive\r\n","");
      Buffer::Append(buffer,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this_00 = &this->body_buffer_;
    sVar2 = Buffer::ReadableSize(this_00);
    this_01 = (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01 != (FileForRead *)0x0) {
      sVar3 = FileForRead::GetFileSize(this_01);
      sVar2 = sVar2 + sVar3;
    }
    iVar1 = snprintf(local_a8,0x40,"Content-Length: %zd\r\n",sVar2);
    Buffer::Append(buffer,local_a8,(long)iVar1);
    p_Var4 = (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->header_map_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        Buffer::Append(buffer,(string *)(p_Var4 + 1));
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,": ","");
        Buffer::Append(buffer,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Buffer::Append(buffer,(string *)(p_Var4 + 2));
        Buffer::AppendCRLF(buffer);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    Buffer::AppendCRLF(buffer);
    Buffer::Append(buffer,this_00);
    if ((this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      Buffer::Append(buffer,this_00);
    }
  }
  return;
}

Assistant:

void HttpResponse::EncodeToBuffer(Buffer* buffer)
{
	if (!buffer)
	{
		return;
	}

	char line_buff[64];
	int len = snprintf(line_buff, sizeof line_buff, "HTTP/1.1 %s\r\n", StatusCodeToString(status_code_).c_str());
	buffer->Append(line_buff, len);

	if (close_connection_)
	{
		buffer->Append("Connection: close\r\n");
	}
	else
	{
		buffer->Append("Connection: Keep-Alive\r\n");
	}

	size_t body_size = body_buffer_.ReadableSize();
	if (file_ptr_)
	{
		body_size += file_ptr_->GetFileSize();
	}

	len = snprintf(line_buff, sizeof line_buff, "Content-Length: %zd\r\n", body_size);
	buffer->Append(line_buff, len);


	for (const auto& kv : header_map_)
	{
		buffer->Append(kv.first);
		buffer->Append(": ");
		buffer->Append(kv.second);
		buffer->AppendCRLF();
	}

	buffer->AppendCRLF();

	buffer->Append(&body_buffer_);
	if (file_ptr_)
	{
		buffer->Append(&body_buffer_);
	}
}